

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

void google::protobuf::internal::ExtensionSet::
     ForEachPrefetchImpl<google::protobuf::internal::ExtensionSet::KeyValue_const*,google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0,google::protobuf::internal::ExtensionSet::Prefetch>
               (KeyValue *it,KeyValue *end)

{
  void *pvVar1;
  int local_34;
  KeyValue *pKStack_30;
  int i;
  KeyValue *prefetch;
  int kPrefetchDistance;
  KeyValue *end_local;
  KeyValue *it_local;
  
  local_34 = 0;
  for (pKStack_30 = it; end_local = it, pKStack_30 != end && local_34 < 0x10;
      pKStack_30 = pKStack_30 + 1) {
    pvVar1 = Extension::PrefetchPtr(&pKStack_30->second);
    Prefetch::operator()((Prefetch *)((long)&it_local + 7),pvVar1);
    local_34 = local_34 + 1;
  }
  for (; pKStack_30 != end; pKStack_30 = pKStack_30 + 1) {
    _InternalSerializeAllImpl::anon_class_32_4_26f63238::operator()
              ((anon_class_32_4_26f63238 *)&stack0x00000008,end_local->first,&end_local->second);
    pvVar1 = Extension::PrefetchPtr(&pKStack_30->second);
    Prefetch::operator()((Prefetch *)((long)&it_local + 7),pvVar1);
    end_local = end_local + 1;
  }
  for (; end_local != end; end_local = end_local + 1) {
    _InternalSerializeAllImpl::anon_class_32_4_26f63238::operator()
              ((anon_class_32_4_26f63238 *)&stack0x00000008,end_local->first,&end_local->second);
  }
  return;
}

Assistant:

static void ForEachPrefetchImpl(Iterator it, Iterator end,
                                  KeyValueFunctor func,
                                  PrefetchFunctor prefetch_func) {
    // Note: based on arena's ChunkList::Cleanup().
    // Prefetch distance 16 performs better than 8 in load tests.
    constexpr int kPrefetchDistance = 16;
    Iterator prefetch = it;
    // Prefetch the first kPrefetchDistance extensions.
    for (int i = 0; prefetch != end && i < kPrefetchDistance; ++prefetch, ++i) {
      prefetch_func(prefetch->second.PrefetchPtr());
    }
    // For the middle extensions, call func and then prefetch the extension
    // kPrefetchDistance after the current one.
    for (; prefetch != end; ++it, ++prefetch) {
      func(it->first, it->second);
      prefetch_func(prefetch->second.PrefetchPtr());
    }
    // Call func on the rest without prefetching.
    for (; it != end; ++it) func(it->first, it->second);
  }